

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

ssize_t dma_write(nettlp *nt,uintptr_t addr,void *buf,size_t count)

{
  uint16_t uVar1;
  int iVar2;
  ssize_t sVar3;
  size_t in_RCX;
  undefined8 in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint32_t dst_addr32;
  uint64_t dst_addr64;
  tlp_mr_hdr mh;
  nettlp_hdr nh;
  iovec iov [6];
  char pad [4];
  int n;
  int ret;
  __uint32_t local_b4;
  __uint64_t local_b0;
  byte local_a6 [2];
  uint16_t local_a4;
  uint16_t local_a2;
  undefined1 local_a0;
  byte local_9f;
  undefined1 local_9e [6];
  iovec local_98;
  byte *local_88;
  long local_80;
  __uint64_t *local_78;
  long local_70;
  undefined1 *local_68;
  long local_60;
  undefined8 local_58;
  size_t local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 local_34 [4];
  int local_30;
  size_t local_28;
  undefined8 local_20;
  ulong local_18;
  long local_10;
  long local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_34,0,4);
  memset(local_9e,0,6);
  memset(local_a6,0,8);
  local_98.iov_base = local_9e;
  local_98.iov_len = 6;
  local_88 = local_a6;
  local_80 = 8;
  local_68 = local_34;
  local_60 = 0;
  local_58 = local_20;
  local_50 = local_28;
  local_48 = local_34;
  local_40 = 0;
  if (local_18 < 0xffffffff) {
    local_a6[0] = local_a6[0] & 0x80 | 0x40;
    local_b4 = __bswap_32((uint)local_18 & 0xfffffffc);
    local_78 = (__uint64_t *)&local_b4;
    local_70 = 4;
  }
  else {
    local_a6[0] = local_a6[0] & 0x80 | 0x60;
    local_b0 = __bswap_64(local_18 & 0xfffffffffffffffc);
    local_78 = &local_b0;
    local_70 = 8;
  }
  local_a2 = ntohs(*(uint16_t *)(local_10 + 8));
  local_a0 = *(undefined1 *)(local_10 + 10);
  iVar2 = tlp_calculate_lstdw(local_18,local_28);
  local_9f = local_9f & 0xf | (char)iVar2 << 4;
  iVar2 = tlp_calculate_fstdw(local_18,local_28);
  local_9f = local_9f & 0xf0 | (byte)iVar2 & 0xf;
  uVar1 = ntohs(local_a4);
  iVar2 = tlp_calculate_length(local_18,local_28);
  local_a4 = htons(uVar1 & 0xfc00 | (ushort)iVar2);
  if (((local_9f & 0xf) != 0) && ((local_9f & 0xf) != 0xf)) {
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      if (((uint)(local_9f & 0xf) & 1 << ((byte)local_30 & 0x1f)) == 0) {
        local_60 = local_60 + 1;
      }
    }
  }
  if ((local_9f >> 4 != 0) && (local_9f >> 4 != 0xf)) {
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      if (((uint)(local_9f >> 4) & 8 >> ((byte)local_30 & 0x1f)) == 0) {
        local_40 = local_40 + 1;
      }
    }
  }
  sVar3 = writev(*(int *)(local_10 + 0x10),&local_98,6);
  iVar2 = (int)sVar3;
  if (iVar2 < 0) {
    local_8 = (long)iVar2;
  }
  else if ((ulong)(long)iVar2 < local_98.iov_len + local_80 + local_70) {
    local_8 = -2;
  }
  else {
    local_8 = (long)iVar2 - (local_98.iov_len + local_80 + local_70 + local_60 + local_40);
  }
  return local_8;
}

Assistant:

ssize_t dma_write(struct nettlp *nt, uintptr_t addr, void *buf, size_t count)
{
	int ret, n;
	char pad[4] = { 0, 0, 0, 0 };
	struct iovec iov[6];
	struct nettlp_hdr nh;
	struct tlp_mr_hdr mh;
	uint64_t dst_addr64;
	uint32_t dst_addr32;

	memset(&nh, 0, sizeof(nh));
	memset(&mh, 0, sizeof(mh));

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &mh;
	iov[1].iov_len = sizeof(mh);
	iov[3].iov_base = pad;
	iov[3].iov_len = 0;	/* if needed, increment for padding */
	iov[4].iov_base = buf;
	iov[4].iov_len = count;
	iov[5].iov_base = pad;
	iov[5].iov_len = 0;	/* if needed, increment for padding */


	/* build memory write request */
	tlp_set_type(mh.tlp.fmt_type, TLP_TYPE_MWr);
	if (addr < UINT32_MAX) {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_W_DATA);
		dst_addr32 = htobe32(addr & 0xFFFFFFFC);
		iov[2].iov_base = &dst_addr32;
		iov[2].iov_len = sizeof(dst_addr32);
	} else {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_4DW, TLP_FMT_W_DATA);
		dst_addr64 = htobe64(addr & 0xFFFFFFFFFFFFFFFC);
		iov[2].iov_base = &dst_addr64;
		iov[2].iov_len = sizeof(dst_addr64);
	}
	mh.requester = ntohs(nt->requester);
	mh.tag = nt->tag;
	mh.lstdw = tlp_calculate_lstdw(addr, count);
	mh.fstdw = tlp_calculate_fstdw(addr, count);
	tlp_set_length(mh.tlp.falen, tlp_calculate_length(addr, count));

	/* XXX:
	 * 
	 * 1st DW BE is used and not 0xF, move the buffer, if 1st DW
	 * is xx10, x100, or 1000. It needs padding.
	 */
	if (mh.fstdw && mh.fstdw != 0xF) {
		for (n = 0; n < 3; n++) {
			if ((mh.fstdw & (0x1 << n)) == 0) {
				/* this byte is not used. padding! */
				iov[3].iov_len++;
			}
		}
	}

	if (mh.lstdw && mh.lstdw != 0xF) {
		for (n = 0; n < 3; n++) {
			if ((mh.lstdw & (0x8 >> n)) == 0) {
				/* this byte is not used, padding! */
				iov[5].iov_len++;
			}
		}
	}


	ret = writev(nt->sockfd, iov, 6);
	if (ret < 0)
		return ret;

	if (ret < (iov[0].iov_len + iov[1].iov_len + iov[2].iov_len)) {
		/* failed to write the whole packet */
		return -2;
	}

	return ret - (iov[0].iov_len + iov[1].iov_len + iov[2].iov_len
		      + iov[3].iov_len + iov[5].iov_len);
}